

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkAbsCreateLogic
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Vec_Wec_t *vConstrs,Wlc_Obj_t *pConstrOut)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Wlc_Obj_t *pWVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *p_00;
  int *piVar12;
  Vec_Int_t *p_01;
  long lVar13;
  ulong uVar14;
  int iVar15;
  Wlc_Obj_t *pWVar16;
  long lVar17;
  Wlc_Obj_t *pWVar18;
  Wlc_Obj_t *pWVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  Wlc_Obj_t *pWVar24;
  long lVar25;
  Wlc_Obj_t *local_88;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar12 = (int *)malloc(400);
  p_00->pArray = piVar12;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar12 = (int *)malloc(400);
  p_01->pArray = piVar12;
  if (vNewObjs->nSize != vNodeFrames->nSize * 2) {
    __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x19f,
                  "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                 );
  }
  if (0 < vConstrs->nSize) {
    lVar25 = 0;
    do {
      pVVar7 = vConstrs->pArray;
      if (pVVar7[lVar25].nSize != 0) {
        if (pVVar7[lVar25].nSize < 2) {
          __assert_fail("Vec_IntSize(vTrace) >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x1a4,
                        "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                       );
        }
        p_01->nSize = 0;
        if ((long)pVVar7[lVar25].nSize < 1) {
LAB_0035cb0c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar20 = *pVVar7[lVar25].pArray;
        lVar13 = (long)vNodeFrames->nSize;
        iVar15 = -1;
        lVar21 = 0xffffffff;
        if (0 < lVar13) {
          lVar21 = 0;
          do {
            if (vNodeFrames->pArray[lVar21] == uVar20) goto LAB_0035c0c0;
            lVar21 = lVar21 + 1;
          } while (lVar13 != lVar21);
          lVar21 = 0xffffffff;
        }
LAB_0035c0c0:
        uVar23 = pVVar7[lVar25].pArray[(long)pVVar7[lVar25].nSize + -1];
        if (0 < vNodeFrames->nSize) {
          lVar17 = 0;
          do {
            if (vNodeFrames->pArray[lVar17] == uVar23) {
              iVar15 = (int)lVar17;
              break;
            }
            lVar17 = lVar17 + 1;
          } while (lVar13 != lVar17);
        }
        iVar10 = (int)lVar21;
        if ((iVar10 < 0) || (iVar15 < 0)) {
          __assert_fail("Index[0] >= 0 && Index[1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x1ac,
                        "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                       );
        }
        uVar9 = iVar10 * 2;
        uVar2 = vNewObjs->nSize;
        if (uVar2 == uVar9 || SBORROW4(uVar2,uVar9) != (int)(uVar2 + iVar10 * -2) < 0)
        goto LAB_0035cb0c;
        piVar12 = vNewObjs->pArray;
        iVar10 = piVar12[uVar9];
        if (((long)iVar10 < 1) || (iVar11 = pNew->nObjsAlloc, iVar11 <= iVar10)) goto LAB_0035caed;
        uVar22 = iVar15 * 2;
        if (uVar2 == uVar22 || SBORROW4(uVar2,uVar22) != (int)(uVar2 + iVar15 * -2) < 0)
        goto LAB_0035cb0c;
        iVar15 = piVar12[uVar22];
        if (((long)iVar15 < 1) || (iVar11 <= iVar15)) goto LAB_0035caed;
        if ((int)uVar2 <= (int)(uVar9 | 1)) goto LAB_0035cb0c;
        iVar3 = piVar12[uVar9 | 1];
        if (((long)iVar3 < 1) || (iVar11 <= iVar3)) goto LAB_0035caed;
        if ((int)uVar2 <= (int)(uVar22 | 1)) goto LAB_0035cb0c;
        iVar4 = piVar12[uVar22 | 1];
        if (((long)iVar4 < 1) || (iVar11 <= iVar4)) goto LAB_0035caed;
        uVar23 = uVar23 >> 1 & 0x3ff;
        pWVar16 = pNew->pObjs;
        pWVar24 = pWVar16 + iVar10;
        local_88 = pWVar16 + iVar3;
        if ((uVar20 >> 1 & 0x3ff) == uVar23) {
          if ((undefined1  [24])((undefined1  [24])*pWVar24 & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x3) goto LAB_0035cb4a;
          iVar10 = (pNew->vPis).nSize;
          iVar3 = (pNew->vPos).nSize;
          uVar20 = ((pWVar24->field_10).Fanins[1] + iVar3) - iVar10;
          if (((int)uVar20 < 0) || (iVar5 = (pNew->vCos).nSize, iVar5 <= (int)uVar20))
          goto LAB_0035cb0c;
          piVar12 = (pNew->vCos).pArray;
          iVar6 = piVar12[uVar20];
          if (((long)iVar6 < 1) || (iVar11 <= iVar6)) goto LAB_0035caed;
          if ((undefined1  [24])((undefined1  [24])*local_88 & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x3) goto LAB_0035cb4a;
          uVar20 = (iVar3 - iVar10) + (local_88->field_10).Fanins[1];
          if (((int)uVar20 < 0) || (iVar5 <= (int)uVar20)) goto LAB_0035cb0c;
          iVar10 = piVar12[uVar20];
          if (((long)iVar10 < 1) || (iVar11 <= iVar10)) goto LAB_0035caed;
          pWVar24 = pWVar16 + iVar6;
          local_88 = pWVar16 + iVar10;
        }
        if ((undefined1  [24])((undefined1  [24])pWVar16[iVar15] & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x3) {
LAB_0035cb4a:
          __assert_fail("pObj->Type == WLC_OBJ_FO",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
        }
        iVar10 = (pNew->vPis).nSize;
        iVar3 = (pNew->vPos).nSize;
        uVar20 = (pWVar16[iVar15].field_10.Fanins[1] + iVar3) - iVar10;
        if (((int)uVar20 < 0) || (iVar15 = (pNew->vCos).nSize, iVar15 <= (int)uVar20))
        goto LAB_0035cb0c;
        piVar12 = (pNew->vCos).pArray;
        iVar5 = piVar12[uVar20];
        if (((long)iVar5 < 1) || (iVar11 <= iVar5)) goto LAB_0035caed;
        if ((undefined1  [24])((undefined1  [24])pWVar16[iVar4] & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x3) goto LAB_0035cb4a;
        uVar20 = (iVar3 - iVar10) + pWVar16[iVar4].field_10.Fanins[1];
        if (((int)uVar20 < 0) || (iVar15 <= (int)uVar20)) goto LAB_0035cb0c;
        iVar15 = piVar12[uVar20];
        if (((long)iVar15 < 1) ||
           (((iVar11 <= iVar15 || (uVar20 = Wlc_ObjAlloc(pNew,0x1f,0,0,0), (int)uVar20 < 1)) ||
            (pNew->nObjsAlloc <= (int)uVar20)))) goto LAB_0035caed;
        pWVar8 = pNew->pObjs;
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (int *)0x0) {
            piVar12 = (int *)malloc(8);
          }
          else {
            piVar12 = (int *)realloc(vFanins->pArray,8);
          }
          vFanins->pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_0035cb88;
          vFanins->nCap = 2;
        }
        pWVar1 = pWVar16 + iVar5;
        pWVar19 = pWVar8 + uVar20;
        piVar12 = vFanins->pArray;
        lVar13 = 0;
        do {
          pWVar18 = pWVar1;
          if (lVar13 == 0) {
            pWVar18 = pWVar24;
          }
          piVar12[lVar13] = (int)((ulong)((long)pWVar18 - (long)pWVar8) >> 3) * -0x55555555;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 2);
        vFanins->nSize = 2;
        Wlc_ObjAddFanins(pNew,pWVar19,vFanins);
        Vec_IntPush(p_01,(int)((ulong)((long)pWVar19 - (long)pNew->pObjs) >> 3) * -0x55555555);
        uVar20 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
        if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
        pWVar24 = pNew->pObjs;
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (int *)0x0) {
            piVar12 = (int *)malloc(8);
          }
          else {
            piVar12 = (int *)realloc(vFanins->pArray,8);
          }
          vFanins->pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_0035cb88;
          vFanins->nCap = 2;
        }
        pWVar8 = pWVar24 + uVar20;
        piVar12 = vFanins->pArray;
        lVar13 = 0;
        do {
          pWVar19 = pWVar16 + iVar15;
          if (lVar13 == 0) {
            pWVar19 = local_88;
          }
          piVar12[lVar13] = (int)((ulong)((long)pWVar19 - (long)pWVar24) >> 3) * -0x55555555;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 2);
        vFanins->nSize = 2;
        Wlc_ObjAddFanins(pNew,pWVar8,vFanins);
        Vec_IntPush(p_01,(int)((ulong)((long)pWVar8 - (long)pNew->pObjs) >> 3) * -0x55555555);
        uVar14 = (ulong)(uint)pVVar7[lVar25].nSize;
        if (2 < pVVar7[lVar25].nSize) {
          lVar13 = 1;
          do {
            if ((int)uVar14 <= lVar13) goto LAB_0035cb0c;
            uVar20 = pVVar7[lVar25].pArray[lVar13];
            iVar15 = -1;
            if (0 < (long)vNodeFrames->nSize) {
              lVar21 = 0;
              do {
                if (vNodeFrames->pArray[lVar21] == uVar20) {
                  iVar15 = (int)lVar21;
                  break;
                }
                lVar21 = lVar21 + 1;
              } while (vNodeFrames->nSize != lVar21);
            }
            if (iVar15 < 0) {
              __assert_fail("Index[0] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                            ,0x1cf,
                            "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                           );
            }
            uVar9 = iVar15 * 2;
            uVar2 = vNewObjs->nSize;
            if (uVar2 == uVar9 || SBORROW4(uVar2,uVar9) != (int)(uVar2 + iVar15 * -2) < 0)
            goto LAB_0035cb0c;
            iVar15 = vNewObjs->pArray[uVar9];
            if (((long)iVar15 < 1) || (pNew->nObjsAlloc <= iVar15)) goto LAB_0035caed;
            pWVar16 = pNew->pObjs;
            pWVar24 = pWVar16 + iVar15;
            if ((uVar20 >> 1 & 0x3ff) == uVar23) {
              if ((undefined1  [24])((undefined1  [24])*pWVar24 & (undefined1  [24])0x3f) !=
                  (undefined1  [24])0x3) goto LAB_0035cb4a;
              uVar22 = ((pWVar24->field_10).Fanins[1] + (pNew->vPos).nSize) - (pNew->vPis).nSize;
              if (((int)uVar22 < 0) || ((pNew->vCos).nSize <= (int)uVar22)) goto LAB_0035cb0c;
              iVar15 = (pNew->vCos).pArray[uVar22];
              if (((long)iVar15 < 1) || (pNew->nObjsAlloc <= iVar15)) goto LAB_0035caed;
              pWVar24 = pWVar16 + iVar15;
            }
            if ((int)uVar2 <= (int)(uVar9 | 1)) goto LAB_0035cb0c;
            if (vNewObjs->pArray[uVar9 | 1] == 0) {
              uVar20 = (int)uVar20 >> 0xb;
              if (((int)uVar20 < 1) || (p->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
              if ((undefined1  [24])((undefined1  [24])p->pObjs[uVar20] & (undefined1  [24])0x3f) !=
                  (undefined1  [24])0x8) {
                __assert_fail("Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x1d6,
                              "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                             );
              }
            }
            else {
              iVar10 = pWVar24->End - pWVar24->Beg;
              iVar15 = -iVar10;
              if (0 < iVar10) {
                iVar15 = iVar10;
              }
              iVar11 = pWVar1->End - pWVar1->Beg;
              iVar10 = -iVar11;
              if (0 < iVar11) {
                iVar10 = iVar11;
              }
              if (iVar15 != iVar10) {
                __assert_fail("Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x1db,
                              "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                             );
              }
              uVar20 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
              if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
              pWVar16 = pNew->pObjs;
              if (vFanins->nCap < 2) {
                if (vFanins->pArray == (int *)0x0) {
                  piVar12 = (int *)malloc(8);
                }
                else {
                  piVar12 = (int *)realloc(vFanins->pArray,8);
                }
                vFanins->pArray = piVar12;
                if (piVar12 == (int *)0x0) goto LAB_0035cb88;
                vFanins->nCap = 2;
              }
              pWVar8 = pWVar16 + uVar20;
              piVar12 = vFanins->pArray;
              lVar21 = 0;
              do {
                pWVar19 = pWVar1;
                if (lVar21 == 0) {
                  pWVar19 = pWVar24;
                }
                piVar12[lVar21] = (int)((ulong)((long)pWVar19 - (long)pWVar16) >> 3) * -0x55555555;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 2);
              vFanins->nSize = 2;
              Wlc_ObjAddFanins(pNew,pWVar8,vFanins);
              pWVar16 = pNew->pObjs;
              pWVar24 = pWVar8;
            }
            Vec_IntPush(p_01,(int)((ulong)((long)pWVar24 - (long)pWVar16) >> 3) * -0x55555555);
            lVar13 = lVar13 + 1;
            uVar14 = (ulong)pVVar7[lVar25].nSize;
          } while (lVar13 < (long)(uVar14 - 1));
        }
        uVar20 = Wlc_ObjAlloc(pNew,0x17,0,p_01->nSize + -1,0);
        if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
        pWVar24 = pNew->pObjs;
        Wlc_ObjAddFanins(pNew,pWVar24 + uVar20,p_01);
        pWVar16 = pNew->pObjs;
        if (vFanins->nCap < 1) {
          if (vFanins->pArray == (int *)0x0) {
            piVar12 = (int *)malloc(4);
          }
          else {
            piVar12 = (int *)realloc(vFanins->pArray,4);
          }
          vFanins->pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_0035cb88;
          vFanins->nCap = 1;
        }
        *vFanins->pArray =
             (int)((ulong)((long)(pWVar24 + uVar20) - (long)pWVar16) >> 3) * -0x55555555;
        vFanins->nSize = 1;
        uVar20 = Wlc_ObjAlloc(pNew,0x25,0,0,0);
        if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
        pWVar24 = pNew->pObjs;
        Wlc_ObjAddFanins(pNew,pWVar24 + uVar20,vFanins);
        Vec_IntPush(p_00,(int)((ulong)((long)(pWVar24 + uVar20) - (long)pNew->pObjs) >> 3) *
                         -0x55555555);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < vConstrs->nSize);
  }
  if (p_00->nSize < 1) {
    uVar20 = Wlc_ObjAlloc(pNew,6,0,0,0);
    if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
    pWVar24 = pNew->pObjs + uVar20;
    if (vFanins->nCap < 1) {
      if (vFanins->pArray == (int *)0x0) {
        piVar12 = (int *)malloc(4);
      }
      else {
        piVar12 = (int *)realloc(vFanins->pArray,4);
      }
      vFanins->pArray = piVar12;
      if (piVar12 == (int *)0x0) goto LAB_0035cb88;
      vFanins->nCap = 1;
    }
    *vFanins->pArray = 0;
    vFanins->nSize = 1;
  }
  else {
    uVar20 = Wlc_ObjAlloc(pNew,0x17,0,p_00->nSize + -1,0);
    if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) {
LAB_0035caed:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    pWVar24 = pNew->pObjs;
    Wlc_ObjAddFanins(pNew,pWVar24 + uVar20,p_00);
    pWVar16 = pNew->pObjs;
    if (vFanins->nCap < 1) {
      if (vFanins->pArray == (int *)0x0) {
        piVar12 = (int *)malloc(4);
      }
      else {
        piVar12 = (int *)realloc(vFanins->pArray,4);
      }
      vFanins->pArray = piVar12;
      if (piVar12 == (int *)0x0) goto LAB_0035cb88;
      vFanins->nCap = 1;
    }
    *vFanins->pArray = (int)((ulong)((long)(pWVar24 + uVar20) - (long)pWVar16) >> 3) * -0x55555555;
    vFanins->nSize = 1;
    uVar20 = Wlc_ObjAlloc(pNew,0x26,0,0,0);
    if (((int)uVar20 < 1) || (pNew->nObjsAlloc <= (int)uVar20)) goto LAB_0035caed;
    pWVar24 = pNew->pObjs + uVar20;
  }
  Wlc_ObjAddFanins(pNew,pWVar24,vFanins);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  pWVar16 = pNew->pObjs;
  if (vFanins->nCap < 1) {
    if (vFanins->pArray == (int *)0x0) {
      piVar12 = (int *)malloc(4);
    }
    else {
      piVar12 = (int *)realloc(vFanins->pArray,4);
    }
    vFanins->pArray = piVar12;
    if (piVar12 == (int *)0x0) {
LAB_0035cb88:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFanins->nCap = 1;
  }
  *vFanins->pArray = (int)((ulong)((long)pWVar24 - (long)pWVar16) >> 3) * -0x55555555;
  vFanins->nSize = 1;
  Wlc_ObjAddFanins(pNew,pConstrOut,vFanins);
  return;
}

Assistant:

void Wlc_NtkAbsCreateLogic( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Vec_Wec_t * vConstrs, Wlc_Obj_t * pConstrOut ) 
{
    Vec_Int_t * vTrace; 
    Vec_Int_t * vBitConstr = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevConstr = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pAddrs[2], * pDatas[2], * pCond, * pConstr = NULL;
    int i, k, Entry, Index[2], iFrameLast, iFrameThis;
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    Vec_WecForEachLevel( vConstrs, vTrace, i )
    {
        if ( Vec_IntSize(vTrace) == 0 ) 
            continue;
        assert( Vec_IntSize(vTrace) >= 2 );
        Vec_IntClear( vLevConstr );

        iFrameThis = (Vec_IntEntry(vTrace, 0)  >> 1) & 0x3FF;
        iFrameLast = (Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;

        Index[0] = Vec_IntFind( vNodeFrames, Vec_IntEntry(vTrace, 0) );
        Index[1] = Vec_IntFind( vNodeFrames, Vec_IntEntryLast(vTrace) );
        assert( Index[0] >= 0 && Index[1] >= 0 );

        pAddrs[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
        pAddrs[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]) );

        pDatas[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]+1) );
        pDatas[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]+1) );

        // redirect the source in the last time frame to point to FOs
        if ( iFrameThis == iFrameLast )
        {
            pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            pDatas[0] = Wlc_ObjFo2Fi(pNew, pDatas[0]);
        }

        // redirect the sink in the last time frame to point to FOs
        pAddrs[1] = Wlc_ObjFo2Fi(pNew, pAddrs[1]);
        pDatas[1] = Wlc_ObjFo2Fi(pNew, pDatas[1]);

        // equal addresses
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        // different datas
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pDatas[0]), Wlc_ObjId(pNew, pDatas[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        Vec_IntForEachEntryStartStop( vTrace, Entry, k, 1, Vec_IntSize(vTrace)-1 )
        {
            iFrameThis = (Entry >> 1) & 0x3FF;
            Index[0]   = Vec_IntFind( vNodeFrames, Entry );            
            assert( Index[0] >= 0 );
            pAddrs[0]  = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
            // redirect the middle in the last time frame to point to FOs
            if ( iFrameThis == iFrameLast )
                pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            if ( Vec_IntEntry(vNewObjs, 2*Index[0]+1) == 0 ) // MUX
            {
                assert( Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pAddrs[0]) );
            }
            else // different addresses
            {
                assert( Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1]) );
                pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );
            }
        }

        // create last output
        pConstr = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vLevConstr)-1, 0) );
        Wlc_ObjAddFanins( pNew, pConstr, vLevConstr );
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_AND, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );

        // save the result
        Vec_IntPush( vBitConstr, Wlc_ObjId(pNew, pConstr) );
    }
    if ( Vec_IntSize(vBitConstr) > 0 )
    {
        // create last output
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vBitConstr)-1, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vBitConstr );
        // create last output
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_OR, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    else
    {
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, 0, 0));
        Vec_IntFill( vFanins, 1, 0 ); // const0 - always true
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    // cleanup
    Vec_IntFree( vBitConstr );
    Vec_IntFree( vLevConstr );
    // add the constraint as fanin to the output
    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
    Wlc_ObjAddFanins( pNew, pConstrOut, vFanins );
}